

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryOpenGL.cpp
# Opt level: O0

void __thiscall
Diligent::EngineFactoryOpenGLImpl::CreateDeviceAndSwapChainGL
          (EngineFactoryOpenGLImpl *this,EngineGLCreateInfo *EngineCI,IRenderDevice **ppDevice,
          IDeviceContext **ppImmediateContext,SwapChainDesc *SCDesc,ISwapChain **ppSwapChain)

{
  undefined *puVar1;
  undefined8 uVar2;
  Char *Message;
  char (*in_stack_fffffffffffffab8) [2];
  Char *local_520;
  runtime_error *anon_var_0;
  SwapChainGLImpl *local_4a0;
  TSwapChain *pSwapChainGL;
  MakeNewRCObj<Diligent::DeviceContextGLImpl,_Diligent::IMemoryAllocator> local_480;
  DeviceContextImplType *local_458;
  DeviceContextGLImpl *pDeviceContextOpenGL;
  EngineFactoryOpenGLImpl *local_448;
  MakeNewRCObj<Diligent::RenderDeviceGLImpl,_Diligent::IMemoryAllocator> local_440;
  RenderDeviceGLImpl *local_418;
  RenderDeviceGLImpl *pRenderDeviceOpenGL;
  IMemoryAllocator *RawMemAllocator;
  GraphicsAdapterInfo AdapterInfo;
  string _msg_2;
  string _msg_1;
  string msg;
  char local_5c [4];
  undefined1 local_58 [8];
  string _msg;
  ISwapChain **ppSwapChain_local;
  SwapChainDesc *SCDesc_local;
  IDeviceContext **ppImmediateContext_local;
  IRenderDevice **ppDevice_local;
  EngineGLCreateInfo *EngineCI_local;
  EngineFactoryOpenGLImpl *this_local;
  
  _msg.field_2._8_8_ = ppSwapChain;
  if (*(int *)EngineCI == 0x3e808) {
    if (((ppDevice == (IRenderDevice **)0x0) || (ppImmediateContext == (IDeviceContext **)0x0)) ||
       (ppSwapChain == (ISwapChain **)0x0)) {
      FormatString<char[22]>
                ((string *)((long)&_msg_1.field_2 + 8),(char (*) [22])"Null pointer provided");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"CreateDeviceAndSwapChainGL",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/EngineFactoryOpenGL.cpp"
                 ,0xd4);
      std::__cxx11::string::~string((string *)(_msg_1.field_2._M_local_buf + 8));
    }
    if (((ppDevice != (IRenderDevice **)0x0) && (ppImmediateContext != (IDeviceContext **)0x0)) &&
       (_msg.field_2._8_8_ != 0)) {
      if (*(int *)(EngineCI + 0x1c) == 0) {
        if (*(uint *)(EngineCI + 0x18) < 2) {
          *ppDevice = (IRenderDevice *)0x0;
          *ppImmediateContext = (IDeviceContext *)0x0;
          *(undefined8 *)_msg.field_2._8_8_ = 0;
          GraphicsAdapterInfo::GraphicsAdapterInfo((GraphicsAdapterInfo *)&RawMemAllocator);
          SetDefaultGraphicsAdapterInfo((GraphicsAdapterInfo *)&RawMemAllocator);
          VerifyEngineCreateInfo
                    ((EngineCreateInfo *)EngineCI,(GraphicsAdapterInfo *)&RawMemAllocator);
          SetRawAllocator(*(IMemoryAllocator **)(EngineCI + 0x58));
          pRenderDeviceOpenGL = (RenderDeviceGLImpl *)GetRawAllocator();
          SetPreferredAdapter(EngineCI);
          MakeNewRCObj<Diligent::RenderDeviceGLImpl,_Diligent::IMemoryAllocator>::MakeNewRCObj
                    (&local_440,(IMemoryAllocator *)pRenderDeviceOpenGL,
                     "TRenderDeviceGLImpl instance",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/EngineFactoryOpenGL.cpp"
                     ,0xf3,(IObject *)0x0);
          pDeviceContextOpenGL = (DeviceContextGLImpl *)SCDesc;
          local_448 = this;
          local_418 = MakeNewRCObj<Diligent::RenderDeviceGLImpl,Diligent::IMemoryAllocator>::
                      operator()((MakeNewRCObj<Diligent::RenderDeviceGLImpl,Diligent::IMemoryAllocator>
                                  *)&local_440,(IMemoryAllocator *)pRenderDeviceOpenGL,&local_448,
                                 EngineCI,(SwapChainDesc **)&pDeviceContextOpenGL);
          (**(local_418->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
             super_ObjectBase<Diligent::IRenderDeviceGL>.
             super_RefCountedObject<Diligent::IRenderDeviceGL>.super_IRenderDeviceGL.
             super_IRenderDevice.super_IObject._vptr_IObject)(local_418,IID_RenderDevice,ppDevice);
          MakeNewRCObj<Diligent::DeviceContextGLImpl,_Diligent::IMemoryAllocator>::MakeNewRCObj
                    (&local_480,(IMemoryAllocator *)pRenderDeviceOpenGL,
                     "DeviceContextGLImpl instance",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/EngineFactoryOpenGL.cpp"
                     ,0xfa,(IObject *)0x0);
          if (*(long *)(EngineCI + 0x10) == 0) {
            local_520 = (Char *)0x0;
          }
          else {
            local_520 = (Char *)**(undefined8 **)(EngineCI + 0x10);
          }
          DeviceContextDesc::DeviceContextDesc
                    ((DeviceContextDesc *)&pSwapChainGL,local_520,COMMAND_QUEUE_TYPE_GRAPHICS,false,
                     0,0);
          local_458 = MakeNewRCObj<Diligent::DeviceContextGLImpl,Diligent::IMemoryAllocator>::
                      operator()(&local_480,&local_418,(DeviceContextDesc *)&pSwapChainGL);
          DeviceContextGLImpl::QueryInterface
                    (local_458,(INTERFACE_ID *)IID_DeviceContext,(IObject **)ppImmediateContext);
          RenderDeviceBase<Diligent::EngineGLImplTraits>::SetImmediateContext
                    (&local_418->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,0,local_458);
          MakeNewRCObj<Diligent::SwapChainGLImpl,_Diligent::IMemoryAllocator>::MakeNewRCObj
                    ((MakeNewRCObj<Diligent::SwapChainGLImpl,_Diligent::IMemoryAllocator> *)
                     &anon_var_0,(IMemoryAllocator *)pRenderDeviceOpenGL,"SwapChainGLImpl instance",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/EngineFactoryOpenGL.cpp"
                     ,0x109,(IObject *)0x0);
          local_4a0 = MakeNewRCObj<Diligent::SwapChainGLImpl,Diligent::IMemoryAllocator>::operator()
                                ((MakeNewRCObj<Diligent::SwapChainGLImpl,Diligent::IMemoryAllocator>
                                  *)&anon_var_0,EngineCI,SCDesc,&local_418,&local_458);
          SwapChainGLImpl::QueryInterface
                    (local_4a0,(INTERFACE_ID *)IID_SwapChain,(IObject **)_msg.field_2._8_8_);
          DeviceContextGLImpl::SetSwapChain(local_458,(ISwapChainGL *)local_4a0);
        }
        else {
          FormatString<char[61]>
                    ((string *)&AdapterInfo.NumQueues,
                     (char (*) [61])"OpenGL back-end does not support multiple immediate contexts");
          puVar1 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar2 = std::__cxx11::string::c_str();
            (*(code *)puVar1)(2,uVar2,0);
          }
          std::__cxx11::string::~string((string *)&AdapterInfo.NumQueues);
        }
      }
      else {
        FormatString<char[51]>
                  ((string *)((long)&_msg_2.field_2 + 8),
                   (char (*) [51])"OpenGL back-end does not support deferred contexts");
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar2 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(2,uVar2,0);
        }
        std::__cxx11::string::~string((string *)(_msg_2.field_2._M_local_buf + 8));
      }
    }
  }
  else {
    local_5c[0] = '\b';
    local_5c[1] = -0x18;
    local_5c[2] = '\x03';
    local_5c[3] = '\0';
    FormatString<char[26],int,char[50],int,char[2]>
              ((string *)local_58,(Diligent *)"Diligent Engine runtime (",(char (*) [26])local_5c,
               (int *)") is not compatible with the client API version (",(char (*) [50])EngineCI,
               (int *)0x46d916,in_stack_fffffffffffffab8);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar2,0);
    }
    std::__cxx11::string::~string((string *)local_58);
  }
  return;
}

Assistant:

void EngineFactoryOpenGLImpl::CreateDeviceAndSwapChainGL(const EngineGLCreateInfo& EngineCI,
                                                         IRenderDevice**           ppDevice,
                                                         IDeviceContext**          ppImmediateContext,
                                                         const SwapChainDesc&      SCDesc,
                                                         ISwapChain**              ppSwapChain)
{
    if (EngineCI.EngineAPIVersion != DILIGENT_API_VERSION)
    {
        LOG_ERROR_MESSAGE("Diligent Engine runtime (", DILIGENT_API_VERSION, ") is not compatible with the client API version (", EngineCI.EngineAPIVersion, ")");
        return;
    }

    VERIFY(ppDevice && ppImmediateContext && ppSwapChain, "Null pointer provided");
    if (!ppDevice || !ppImmediateContext || !ppSwapChain)
        return;

    if (EngineCI.NumDeferredContexts > 0)
    {
        LOG_ERROR_MESSAGE("OpenGL back-end does not support deferred contexts");
        return;
    }

    if (EngineCI.NumImmediateContexts > 1)
    {
        LOG_ERROR_MESSAGE("OpenGL back-end does not support multiple immediate contexts");
        return;
    }

    *ppDevice           = nullptr;
    *ppImmediateContext = nullptr;
    *ppSwapChain        = nullptr;

    try
    {
        GraphicsAdapterInfo AdapterInfo;
        SetDefaultGraphicsAdapterInfo(AdapterInfo);
        VerifyEngineCreateInfo(EngineCI, AdapterInfo);

        SetRawAllocator(EngineCI.pRawMemAllocator);
        IMemoryAllocator& RawMemAllocator = GetRawAllocator();

        SetPreferredAdapter(EngineCI);
        RenderDeviceGLImpl* pRenderDeviceOpenGL{
            NEW_RC_OBJ(RawMemAllocator, "TRenderDeviceGLImpl instance", TRenderDeviceGLImpl)(
                RawMemAllocator, this, EngineCI, &SCDesc //
                )                                        //
        };
        pRenderDeviceOpenGL->QueryInterface(IID_RenderDevice, reinterpret_cast<IObject**>(ppDevice));

        DeviceContextGLImpl* pDeviceContextOpenGL{
            NEW_RC_OBJ(RawMemAllocator, "DeviceContextGLImpl instance", DeviceContextGLImpl)(
                pRenderDeviceOpenGL,
                DeviceContextDesc{
                    EngineCI.pImmediateContextInfo ? EngineCI.pImmediateContextInfo[0].Name : nullptr,
                    COMMAND_QUEUE_TYPE_GRAPHICS,
                    False, // IsDeferred
                    0,     // Context id
                    0      // QueueId
                })         //
        };
        // We must call AddRef() (implicitly through QueryInterface()) because pRenderDeviceOpenGL will
        // keep a weak reference to the context
        pDeviceContextOpenGL->QueryInterface(IID_DeviceContext, reinterpret_cast<IObject**>(ppImmediateContext));
        pRenderDeviceOpenGL->SetImmediateContext(0, pDeviceContextOpenGL);

        TSwapChain* pSwapChainGL = NEW_RC_OBJ(RawMemAllocator, "SwapChainGLImpl instance", TSwapChain)(EngineCI, SCDesc, pRenderDeviceOpenGL, pDeviceContextOpenGL);
        pSwapChainGL->QueryInterface(IID_SwapChain, reinterpret_cast<IObject**>(ppSwapChain));

        pDeviceContextOpenGL->SetSwapChain(pSwapChainGL);
    }
    catch (const std::runtime_error&)
    {
        if (*ppDevice)
        {
            (*ppDevice)->Release();
            *ppDevice = nullptr;
        }

        if (*ppImmediateContext)
        {
            (*ppImmediateContext)->Release();
            *ppImmediateContext = nullptr;
        }

        if (*ppSwapChain)
        {
            (*ppSwapChain)->Release();
            *ppSwapChain = nullptr;
        }

        LOG_ERROR("Failed to initialize OpenGL-based render device");
    }
}